

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::FBXConverter::SetupNodeMetadata(FBXConverter *this,Model *model,aiNode *nd)

{
  TypedProperty<bool> *pTVar1;
  uint uVar2;
  size_t this_00;
  bool bVar3;
  size_type sVar4;
  aiMetadata *paVar5;
  element_type *peVar6;
  bool *value;
  int *value_00;
  unsigned_long *value_01;
  float *value_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pString;
  TypedProperty<aiVector3t<float>_> *this_01;
  aiVector3t<float> *value_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  TypedProperty<aiVector3t<float>_> *interpreted_5;
  TypedProperty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_580;
  TypedProperty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *interpreted_4;
  TypedProperty<float> *interpreted_3;
  TypedProperty<unsigned_long> *interpreted_2;
  TypedProperty<int> *interpreted_1;
  TypedProperty<bool> *interpreted;
  value_type *prop;
  iterator __end2;
  iterator __begin2;
  DirectPropertyMap *__range2;
  string local_530;
  allocator local_509;
  string local_508;
  allocator local_4e1;
  undefined1 local_4e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  aiString local_4a0;
  allocator local_99;
  string local_98;
  uint local_78;
  int index;
  aiMetadata *local_68;
  aiMetadata *data;
  size_t numStaticMetaData;
  DirectPropertyMap unparsedProperties;
  PropertyTable *props;
  aiNode *nd_local;
  Model *model_local;
  FBXConverter *this_local;
  
  unparsedProperties._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)Model::Props(model);
  PropertyTable::GetUnparsedProperties_abi_cxx11_
            ((DirectPropertyMap *)&numStaticMetaData,
             (PropertyTable *)unparsedProperties._M_t._M_impl.super__Rb_tree_header._M_node_count);
  data = (aiMetadata *)0x2;
  sVar4 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>_>_>_>
          ::size((DirectPropertyMap *)&numStaticMetaData);
  paVar5 = aiMetadata::Alloc((int)sVar4 + 2);
  nd->mMetaData = paVar5;
  local_78 = 1;
  local_68 = paVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"UserProperties",&local_99);
  this_00 = unparsedProperties._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_4e0,"UDP3DSMAX",&local_4e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_508,"",&local_509);
  PropertyGet<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_4e0 + 0x20)
             ,(FBX *)this_00,(PropertyTable *)local_4e0,&local_508,in_R8);
  aiString::aiString((aiString *)(local_4e0 + 0x40),(string *)(local_4e0 + 0x20));
  aiMetadata::Set<aiString>(paVar5,0,&local_98,(aiString *)(local_4e0 + 0x40));
  std::__cxx11::string::~string((string *)(local_4e0 + 0x20));
  std::__cxx11::string::~string((string *)&local_508);
  std::allocator<char>::~allocator((allocator<char> *)&local_509);
  std::__cxx11::string::~string((string *)local_4e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  paVar5 = local_68;
  uVar2 = local_78;
  local_78 = local_78 + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_530,"IsNull",(allocator *)((long)&__range2 + 7));
  __range2._6_1_ = Model::IsNull(model);
  aiMetadata::Set<bool>(paVar5,uVar2,&local_530,(bool *)((long)&__range2 + 6));
  std::__cxx11::string::~string((string *)&local_530);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
  __end2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>_>_>_>
           ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>_>_>_>
                    *)&numStaticMetaData);
  prop = (value_type *)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>_>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>_>_>_>
                *)&numStaticMetaData);
  do {
    bVar3 = std::operator!=(&__end2,(_Self *)&prop);
    if (!bVar3) {
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>_>_>_>
              *)&numStaticMetaData);
      return;
    }
    interpreted = (TypedProperty<bool> *)
                  std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>_>_>
                  ::operator*(&__end2);
    peVar6 = std::
             __shared_ptr_access<Assimp::FBX::Property,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Assimp::FBX::Property,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&((reference)interpreted)->second);
    interpreted_1 = (TypedProperty<int> *)Property::As<Assimp::FBX::TypedProperty<bool>>(peVar6);
    paVar5 = local_68;
    uVar2 = local_78;
    pTVar1 = interpreted;
    if ((TypedProperty<bool> *)interpreted_1 == (TypedProperty<bool> *)0x0) {
      peVar6 = std::
               __shared_ptr_access<Assimp::FBX::Property,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Assimp::FBX::Property,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(interpreted + 2));
      interpreted_2 =
           (TypedProperty<unsigned_long> *)Property::As<Assimp::FBX::TypedProperty<int>>(peVar6);
      paVar5 = local_68;
      uVar2 = local_78;
      pTVar1 = interpreted;
      if (interpreted_2 == (TypedProperty<unsigned_long> *)0x0) {
        peVar6 = std::
                 __shared_ptr_access<Assimp::FBX::Property,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<Assimp::FBX::Property,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)(interpreted + 2));
        interpreted_3 =
             (TypedProperty<float> *)Property::As<Assimp::FBX::TypedProperty<unsigned_long>>(peVar6)
        ;
        paVar5 = local_68;
        uVar2 = local_78;
        pTVar1 = interpreted;
        if (interpreted_3 == (TypedProperty<float> *)0x0) {
          peVar6 = std::
                   __shared_ptr_access<Assimp::FBX::Property,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<Assimp::FBX::Property,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)(interpreted + 2));
          interpreted_4 =
               (TypedProperty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)Property::As<Assimp::FBX::TypedProperty<float>>(peVar6);
          paVar5 = local_68;
          uVar2 = local_78;
          pTVar1 = interpreted;
          if (interpreted_4 ==
              (TypedProperty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x0) {
            peVar6 = std::
                     __shared_ptr_access<Assimp::FBX::Property,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<Assimp::FBX::Property,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)(interpreted + 2));
            local_580 = Property::As<Assimp::FBX::TypedProperty<std::__cxx11::string>>(peVar6);
            paVar5 = local_68;
            uVar2 = local_78;
            pTVar1 = interpreted;
            if (local_580 ==
                (TypedProperty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x0) {
              peVar6 = std::
                       __shared_ptr_access<Assimp::FBX::Property,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<Assimp::FBX::Property,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)(interpreted + 2));
              this_01 = Property::As<Assimp::FBX::TypedProperty<aiVector3t<float>>>(peVar6);
              paVar5 = local_68;
              uVar2 = local_78;
              pTVar1 = interpreted;
              if (this_01 == (TypedProperty<aiVector3t<float>_> *)0x0) {
                __assert_fail("false",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                              ,0x387,
                              "void Assimp::FBX::FBXConverter::SetupNodeMetadata(const Model &, aiNode &)"
                             );
              }
              local_78 = local_78 + 1;
              value_03 = TypedProperty<aiVector3t<float>_>::Value(this_01);
              aiMetadata::Set<aiVector3t<float>>(paVar5,uVar2,(string *)pTVar1,value_03);
            }
            else {
              local_78 = local_78 + 1;
              pString = TypedProperty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::Value(local_580);
              aiString::aiString((aiString *)((long)&interpreted_5 + 4),pString);
              aiMetadata::Set<aiString>
                        (paVar5,uVar2,(string *)pTVar1,(aiString *)((long)&interpreted_5 + 4));
            }
          }
          else {
            local_78 = local_78 + 1;
            value_02 = TypedProperty<float>::Value((TypedProperty<float> *)interpreted_4);
            aiMetadata::Set<float>(paVar5,uVar2,(string *)pTVar1,value_02);
          }
        }
        else {
          local_78 = local_78 + 1;
          value_01 = TypedProperty<unsigned_long>::Value
                               ((TypedProperty<unsigned_long> *)interpreted_3);
          aiMetadata::Set<unsigned_long>(paVar5,uVar2,(string *)pTVar1,value_01);
        }
      }
      else {
        local_78 = local_78 + 1;
        value_00 = TypedProperty<int>::Value((TypedProperty<int> *)interpreted_2);
        aiMetadata::Set<int>(paVar5,uVar2,(string *)pTVar1,value_00);
      }
    }
    else {
      local_78 = local_78 + 1;
      value = TypedProperty<bool>::Value((TypedProperty<bool> *)interpreted_1);
      aiMetadata::Set<bool>(paVar5,uVar2,(string *)pTVar1,value);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

void FBXConverter::SetupNodeMetadata(const Model& model, aiNode& nd)
        {
            const PropertyTable& props = model.Props();
            DirectPropertyMap unparsedProperties = props.GetUnparsedProperties();

            // create metadata on node
            const std::size_t numStaticMetaData = 2;
            aiMetadata* data = aiMetadata::Alloc(static_cast<unsigned int>(unparsedProperties.size() + numStaticMetaData));
            nd.mMetaData = data;
            int index = 0;

            // find user defined properties (3ds Max)
            data->Set(index++, "UserProperties", aiString(PropertyGet<std::string>(props, "UDP3DSMAX", "")));
            // preserve the info that a node was marked as Null node in the original file.
            data->Set(index++, "IsNull", model.IsNull() ? true : false);

            // add unparsed properties to the node's metadata
            for (const DirectPropertyMap::value_type& prop : unparsedProperties) {
                // Interpret the property as a concrete type
                if (const TypedProperty<bool>* interpreted = prop.second->As<TypedProperty<bool> >()) {
                    data->Set(index++, prop.first, interpreted->Value());
                }
                else if (const TypedProperty<int>* interpreted = prop.second->As<TypedProperty<int> >()) {
                    data->Set(index++, prop.first, interpreted->Value());
                }
                else if (const TypedProperty<uint64_t>* interpreted = prop.second->As<TypedProperty<uint64_t> >()) {
                    data->Set(index++, prop.first, interpreted->Value());
                }
                else if (const TypedProperty<float>* interpreted = prop.second->As<TypedProperty<float> >()) {
                    data->Set(index++, prop.first, interpreted->Value());
                }
                else if (const TypedProperty<std::string>* interpreted = prop.second->As<TypedProperty<std::string> >()) {
                    data->Set(index++, prop.first, aiString(interpreted->Value()));
                }
                else if (const TypedProperty<aiVector3D>* interpreted = prop.second->As<TypedProperty<aiVector3D> >()) {
                    data->Set(index++, prop.first, interpreted->Value());
                }
                else {
                    ai_assert(false);
                }
            }
        }